

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oprom_parser.c
# Opt level: O0

igsc_oprom_type image_oprom_get_type(igsc_oprom_image *img)

{
  igsc_oprom_type local_14;
  igsc_oprom_type type;
  igsc_oprom_image *img_local;
  
  local_14 = IGSC_OPROM_NONE;
  if ((img->data_part_ptr != (uint8_t *)0x0) && (img->data_part_len != 0)) {
    local_14 = IGSC_OPROM_DATA;
  }
  if ((img->code_part_ptr != (uint8_t *)0x0) && (img->code_part_len != 0)) {
    local_14 = local_14 | IGSC_OPROM_CODE;
  }
  return local_14;
}

Assistant:

enum igsc_oprom_type image_oprom_get_type(struct igsc_oprom_image *img)
{
    enum igsc_oprom_type type = IGSC_OPROM_NONE;

    if (img->data_part_ptr && img->data_part_len)
    {
       type |= IGSC_OPROM_DATA;
    }

    if (img->code_part_ptr && img->code_part_len)
    {
       type |= IGSC_OPROM_CODE;
    }

    return type;
}